

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void __thiscall
sjtu::map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_>::insert_fixup
          (map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_> *this,Node *x)

{
  Node *pNVar1;
  Node *in_RSI;
  map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_> *in_RDI;
  Node *y;
  Node *local_18;
  Node *local_10;
  
  local_10 = in_RSI;
  while (local_10->parent->color == RED) {
    if (local_10->parent->parent->left == local_10->parent) {
      pNVar1 = local_10->parent->parent->right;
      if (pNVar1->color == RED) {
        pNVar1->color = BLACK;
        local_10->parent->color = BLACK;
        pNVar1->parent->color = RED;
        local_10 = pNVar1->parent;
      }
      else {
        pNVar1 = local_10->parent;
        local_18 = pNVar1;
        if (pNVar1->right == local_10) {
          left_rotate(in_RDI,local_10);
          local_18 = pNVar1->parent;
          local_10 = pNVar1;
        }
        right_rotate(in_RDI,local_18);
        std::
        swap<sjtu::map<long,sjtu::LRUCache<sjtu::userType>::CacheNode*,std::less<long>>::color_type>
                  (&local_18->color,&local_18->right->color);
      }
    }
    else {
      pNVar1 = local_10->parent->parent->left;
      if (pNVar1->color == RED) {
        pNVar1->color = BLACK;
        local_10->parent->color = BLACK;
        pNVar1->parent->color = RED;
        local_10 = pNVar1->parent;
      }
      else {
        pNVar1 = local_10->parent;
        local_18 = pNVar1;
        if (pNVar1->left == local_10) {
          right_rotate(in_RDI,local_10);
          local_18 = pNVar1->parent;
          local_10 = pNVar1;
        }
        left_rotate(in_RDI,local_18);
        std::
        swap<sjtu::map<long,sjtu::LRUCache<sjtu::userType>::CacheNode*,std::less<long>>::color_type>
                  (&local_18->color,&local_18->left->color);
      }
    }
  }
  in_RDI->nil->left->color = BLACK;
  return;
}

Assistant:

void insert_fixup(Node *x)
	{
		for (Node *y;x -> parent -> color == RED;)
			if (x -> parent -> parent -> left == x -> parent)
			{
				y = x -> parent -> parent -> right;
				if (y -> color == RED)
				{
					x -> parent -> color = y -> color = BLACK , y -> parent -> color = RED;
					x = y -> parent;
				}
				else
				{
					y = x -> parent;
					if (y -> right == x) left_rotate(x) , x = y , y = x -> parent;
					right_rotate(y) , std::swap(y -> color , y -> right -> color);
				}
			}
			else
			{
				y = x -> parent -> parent -> left;
				if (y -> color == RED)
				{
					x -> parent -> color = y -> color = BLACK , y -> parent -> color = RED;
					x = y -> parent;
				}
				else
				{
					y = x -> parent;
					if (y -> left == x) right_rotate(x) , x = y , y = x -> parent;
					left_rotate(y) , std::swap(y -> color , y -> left -> color);
				}
			}
		nil -> left -> color = BLACK;
	}